

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O0

int32 ** parse_subvecs(char *str)

{
  int iVar1;
  int32 **ppiVar2;
  int32 *piVar3;
  bool bVar4;
  glist_t local_58;
  gnode_t *gn_1;
  gnode_t *gn2;
  gnode_t *gn;
  int32 **subvec;
  glist_t veclist;
  glist_t dimlist;
  int local_20;
  int32 l;
  int32 n2;
  int32 n;
  char *strp;
  char *str_local;
  
  subvec = (int32 **)0x0;
  _n2 = str;
  strp = str;
  do {
    veclist = (glist_t)0x0;
    while( true ) {
      iVar1 = __isoc99_sscanf(_n2,"%d%n",&l,(long)&dimlist + 4);
      if (iVar1 != 1) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,0xbb,"\'%s\': Couldn\'t read int32 @pos %d\n",strp,(long)_n2 - (long)strp);
        exit(1);
      }
      _n2 = _n2 + dimlist._4_4_;
      if (*_n2 == '-') {
        _n2 = _n2 + 1;
        iVar1 = __isoc99_sscanf(_n2,"%d%n",&local_20,(long)&dimlist + 4);
        if (iVar1 != 1) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0xc3,"\'%s\': Couldn\'t read int32 @pos %d\n",strp,(long)_n2 - (long)strp);
          exit(1);
        }
        _n2 = _n2 + dimlist._4_4_;
      }
      else {
        local_20 = l;
      }
      if ((l < 0) || (local_20 < l)) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,0xcb,"\'%s\': Bad subrange spec ending @pos %d\n",strp,(long)_n2 - (long)strp);
        exit(1);
      }
      for (; l <= local_20; l = l + 1) {
        for (local_58 = veclist;
            (local_58 != (glist_t)0x0 && ((local_58->data).ptr != (void *)(long)l));
            local_58 = local_58->next) {
        }
        if (local_58 != (glist_t)0x0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0xd4,"\'%s\': Duplicate dimension ending @pos %d\n",strp,(long)_n2 - (long)strp);
          exit(1);
        }
        veclist = glist_add_int32(veclist,l);
      }
      if ((*_n2 == '\0') || (*_n2 == '/')) break;
      if (*_n2 != ',') {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,0xdd,"\'%s\': Bad delimiter @pos %d\n",strp,(long)_n2 - (long)strp);
        exit(1);
      }
      _n2 = _n2 + 1;
    }
    subvec = (int32 **)glist_add_ptr((glist_t)subvec,veclist);
    if (*_n2 == '\0') {
      l = glist_count((glist_t)subvec);
      ppiVar2 = (int32 **)
                __ckd_calloc__((long)(l + 1),8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                               ,0xed);
      ppiVar2[l] = (int32 *)0x0;
      gn2 = (gnode_t *)subvec;
      while( true ) {
        l = l + -1;
        if (l < 0 || gn2 == (gnode_t *)0x0) {
          if ((l < 0) && (bVar4 = gn2 == (gnode_t *)0x0, gn2 = (gnode_t *)subvec, bVar4)) {
            for (; gn2 != (gnode_t *)0x0; gn2 = gn2->next) {
              glist_free((glist_t)(gn2->data).ptr);
            }
            glist_free((glist_t)subvec);
            return ppiVar2;
          }
          __assert_fail("(n < 0) && (!gn)",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                        ,0xfe,"int32 **parse_subvecs(const char *)");
        }
        gn_1 = (gnode_t *)(gn2->data).ptr;
        local_20 = glist_count(gn_1);
        if (local_20 < 1) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0xf5,"\'%s\': 0-length subvector\n",strp);
          exit(1);
        }
        piVar3 = (int32 *)__ckd_calloc__((long)(local_20 + 1),4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                         ,0xf7);
        ppiVar2[l] = piVar3;
        ppiVar2[l][local_20] = -1;
        for (; local_20 = local_20 + -1, -1 < local_20 && gn_1 != (gnode_t *)0x0; gn_1 = gn_1->next)
        {
          ppiVar2[l][local_20] = (int32)(gn_1->data).i;
        }
        if ((-1 < local_20) || (gn_1 != (gnode_t *)0x0)) break;
        gn2 = gn2->next;
      }
      __assert_fail("(n2 < 0) && (!gn2)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                    ,0xfc,"int32 **parse_subvecs(const char *)");
    }
    if (*_n2 != '/') {
      __assert_fail("*strp == \'/\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                    ,0xe7,"int32 **parse_subvecs(const char *)");
    }
    _n2 = _n2 + 1;
  } while( true );
}

Assistant:

int32 **
parse_subvecs(char const *str)
{
    char const *strp;
    int32 n, n2, l;
    glist_t dimlist;            /* List of dimensions in one subvector */
    glist_t veclist;            /* List of dimlists (subvectors) */
    int32 **subvec;
    gnode_t *gn, *gn2;

    veclist = NULL;

    strp = str;
    for (;;) {
        dimlist = NULL;

        for (;;) {
            if (sscanf(strp, "%d%n", &n, &l) != 1)
                E_FATAL("'%s': Couldn't read int32 @pos %d\n", str,
                        strp - str);
            strp += l;

            if (*strp == '-') {
                strp++;

                if (sscanf(strp, "%d%n", &n2, &l) != 1)
                    E_FATAL("'%s': Couldn't read int32 @pos %d\n", str,
                            strp - str);
                strp += l;
            }
            else
                n2 = n;

            if ((n < 0) || (n > n2))
                E_FATAL("'%s': Bad subrange spec ending @pos %d\n", str,
                        strp - str);

            for (; n <= n2; n++) {
		gnode_t *gn;
		for (gn = dimlist; gn; gn = gnode_next(gn))
		    if (gnode_int32(gn) == n)
			break;
		if (gn != NULL)
                    E_FATAL("'%s': Duplicate dimension ending @pos %d\n",
                            str, strp - str);

                dimlist = glist_add_int32(dimlist, n);
            }

            if ((*strp == '\0') || (*strp == '/'))
                break;

            if (*strp != ',')
                E_FATAL("'%s': Bad delimiter @pos %d\n", str, strp - str);

            strp++;
        }

        veclist = glist_add_ptr(veclist, (void *) dimlist);

        if (*strp == '\0')
            break;

        assert(*strp == '/');
        strp++;
    }

    /* Convert the glists to arrays; remember the glists are in reverse order of the input! */
    n = glist_count(veclist);   /* #Subvectors */
    subvec = (int32 **) ckd_calloc(n + 1, sizeof(int32 *));     /* +1 for sentinel */
    subvec[n] = NULL;           /* sentinel */

    for (--n, gn = veclist; (n >= 0) && gn; gn = gnode_next(gn), --n) {
        gn2 = (glist_t) gnode_ptr(gn);

        n2 = glist_count(gn2);  /* Length of this subvector */
        if (n2 <= 0)
            E_FATAL("'%s': 0-length subvector\n", str);

        subvec[n] = (int32 *) ckd_calloc(n2 + 1, sizeof(int32));        /* +1 for sentinel */
        subvec[n][n2] = -1;     /* sentinel */

        for (--n2; (n2 >= 0) && gn2; gn2 = gnode_next(gn2), --n2)
            subvec[n][n2] = gnode_int32(gn2);
        assert((n2 < 0) && (!gn2));
    }
    assert((n < 0) && (!gn));

    /* Free the glists */
    for (gn = veclist; gn; gn = gnode_next(gn)) {
        gn2 = (glist_t) gnode_ptr(gn);
        glist_free(gn2);
    }
    glist_free(veclist);

    return subvec;
}